

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseThunkFinallyFunction::MarshalCrossSite_TTDInflate
          (JavascriptPromiseThunkFinallyFunction *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptPromiseThunkFinallyFunction *this_local;
  
  bVar2 = VirtualTableInfo<Js::JavascriptPromiseThunkFinallyFunction>::HasVirtualTable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../../Runtime/Library/JavascriptPromise.h"
                                ,0x9f,
                                "(VirtualTableInfo<JavascriptPromiseThunkFinallyFunction>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptPromiseThunkFinallyFunction>_>::SetVirtualTable
            (this);
  return;
}

Assistant:

JavascriptPromiseThunkFinallyFunction(DynamicType* type, FunctionInfo* functionInfo, Var value, bool shouldThrow)
            : RuntimeFunction(type, functionInfo), value(value), shouldThrow(shouldThrow)
        { }